

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_new(uint32_t bw)

{
  BtorSimBitVector *pBVar1;
  uint32_t uVar2;
  ulong __n;
  
  uVar2 = ((bw >> 5) + 1) - (uint)((bw & 0x1f) == 0);
  __n = (ulong)(uVar2 * 4);
  pBVar1 = (BtorSimBitVector *)btorsim_malloc(__n + 8);
  memset(pBVar1 + 1,0,__n);
  pBVar1->len = uVar2;
  pBVar1->width = bw;
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_new (uint32_t bw)
{
  assert (bw > 0);

  uint32_t i;
  BtorSimBitVector *res;

  i = bw / BTORSIM_BV_TYPE_BW;
  if (bw % BTORSIM_BV_TYPE_BW > 0) i += 1;

  assert (i > 0);
  res =
      btorsim_malloc (sizeof (BtorSimBitVector) + sizeof (BTORSIM_BV_TYPE) * i);
  memset (res->bits, 0, i * sizeof *(res->bits));
  res->len = i;
  assert (res->len);
  res->width = bw;
  return res;
}